

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NvmlLib.cpp
# Opt level: O1

bool xmrig::NvmlLib::assign(vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *devices)

{
  int iVar1;
  CudaDevice *device;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *__range2;
  uint32_t i;
  uint32_t count;
  nvmlDevice_t nvmlDevice;
  
  iVar1 = (*pNvmlDeviceGetCount)();
  return iVar1 == 0;
}

Assistant:

bool xmrig::NvmlLib::assign(std::vector<CudaDevice> &devices)
{
    uint32_t count = 0;
    if (pNvmlDeviceGetCount(&count) != NVML_SUCCESS) {
        return false;
    }

    for (uint32_t i = 0; i < count; i++) {
        nvmlDevice_t nvmlDevice;
        if (pNvmlDeviceGetHandleByIndex(i, &nvmlDevice) != NVML_SUCCESS) {
            continue;
        }

        nvmlPciInfo_t pci;
        if (pNvmlDeviceGetPciInfo(nvmlDevice, &pci) != NVML_SUCCESS) {
            continue;
        }

        for (auto &device : devices) {
            if (device.topology().bus() == pci.bus && device.topology().device() == pci.device) {
                device.setNvmlDevice(nvmlDevice);
            }
        }
    }

    return true;
}